

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall Liby::Logger::logger_thread(Logger *this)

{
  ulong uVar1;
  long lVar2;
  void *__ptr;
  size_t __size;
  undefined1 local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> logStr;
  int64_t bytes;
  Logger *this_local;
  
  logStr.field_2._8_8_ = 0;
  do {
    BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pop_wait((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               &this->queue_);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      lVar2 = std::__cxx11::string::size();
      logStr.field_2._8_8_ = logStr.field_2._8_8_ + lVar2;
      __ptr = (void *)std::__cxx11::string::data();
      __size = std::__cxx11::string::size();
      fwrite(__ptr,__size,1,_stderr);
    }
    std::__cxx11::string::~string((string *)local_38);
  } while( true );
}

Assistant:

void Logger::logger_thread() {
    int64_t bytes = 0;
    //    ::alarm(1);
    //    Signal::signal(SIGALRM, [&bytes] {
    //        std::cout << "write " << bytes / (1024 * 1024) << " MB" <<
    //        std::endl;
    //        bytes = 0;
    //        ::alarm(1);
    //    });
    while (1) {
        auto logStr = queue_.pop_wait();
        if (logStr.empty())
            continue;
        bytes += logStr.size();
        ::fwrite(logStr.data(), logStr.size(), 1, stderr);
    }
}